

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_shift_new_globals(REF_NODE ref_node)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  REF_GLOB equal_and_above;
  bool bVar5;
  uint uVar6;
  void *array;
  long local_60;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT proc;
  REF_GLOB total_new_nodes;
  REF_GLOB offset;
  REF_INT *everyones_new_nodes;
  REF_MPI pRStack_20;
  REF_INT new_nodes;
  REF_MPI ref_mpi;
  REF_NODE ref_node_local;
  
  pRStack_20 = ref_node->ref_mpi;
  ref_mpi = (REF_MPI)ref_node;
  if (pRStack_20->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x2d9,
           "ref_node_shift_new_globals","malloc everyones_new_nodes of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    array = malloc((long)pRStack_20->n << 2);
    if (array == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x2d9,
             "ref_node_shift_new_globals","malloc everyones_new_nodes of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      uVar1 = ref_mpi[2].n;
      uVar2 = ref_mpi[1].timing;
      everyones_new_nodes._4_4_ = uVar1 - uVar2;
      uVar6 = ref_mpi_allgather(pRStack_20,(void *)((long)&everyones_new_nodes + 4),array,1);
      if (uVar6 == 0) {
        total_new_nodes = 0;
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_20->id;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          total_new_nodes =
               *(int *)((long)array + (long)ref_private_macro_code_rss * 4) + total_new_nodes;
        }
        _node = 0;
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_20->n;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          _node = *(int *)((long)array + (long)ref_private_macro_code_rss * 4) + _node;
        }
        if (array != (void *)0x0) {
          free(array);
        }
        if (total_new_nodes != 0) {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_mpi->id;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            if (((-1 < ref_private_macro_code_rss_1) && (ref_private_macro_code_rss_1 < ref_mpi->id)
                ) && (-1 < *(long *)((long)ref_mpi->comm + (long)ref_private_macro_code_rss_1 * 8)))
            {
              if (((ref_private_macro_code_rss_1 < 0) ||
                  (ref_mpi->id <= ref_private_macro_code_rss_1)) ||
                 (*(long *)((long)ref_mpi->comm + (long)ref_private_macro_code_rss_1 * 8) < 0)) {
                local_60 = -1;
              }
              else {
                local_60 = *(long *)((long)ref_mpi->comm + (long)ref_private_macro_code_rss_1 * 8);
              }
              lVar3._0_4_ = ref_mpi[1].timing;
              lVar3._4_4_ = ref_mpi[1].reduce_byte_limit;
              if (lVar3 <= local_60) {
                *(REF_GLOB *)((long)ref_mpi->comm + (long)ref_private_macro_code_rss_1 * 8) =
                     total_new_nodes +
                     *(long *)((long)ref_mpi->comm + (long)ref_private_macro_code_rss_1 * 8);
              }
            }
          }
          ref_private_macro_code_rss_1 = ref_mpi->n;
          while( true ) {
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + -1;
            bVar5 = false;
            if (-1 < ref_private_macro_code_rss_1) {
              lVar4._0_4_ = ref_mpi[1].timing;
              lVar4._4_4_ = ref_mpi[1].reduce_byte_limit;
              bVar5 = lVar4 <= *(long *)((long)ref_mpi->start_time +
                                        (long)ref_private_macro_code_rss_1 * 8);
            }
            if (!bVar5) break;
            *(REF_GLOB *)((long)ref_mpi->start_time + (long)ref_private_macro_code_rss_1 * 8) =
                 total_new_nodes +
                 *(long *)((long)ref_mpi->start_time + (long)ref_private_macro_code_rss_1 * 8);
          }
          equal_and_above._0_4_ = ref_mpi[1].timing;
          equal_and_above._4_4_ = ref_mpi[1].reduce_byte_limit;
          uVar6 = ref_node_shift_unused((REF_NODE)ref_mpi,equal_and_above,total_new_nodes);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x2f8,"ref_node_shift_new_globals",(ulong)uVar6,"shift");
            return uVar6;
          }
        }
        ref_node_local._4_4_ =
             ref_node_initialize_n_global((REF_NODE)ref_mpi,_node + *(long *)&ref_mpi[1].timing);
        if (ref_node_local._4_4_ == 0) {
          ref_node_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x2fd,"ref_node_shift_new_globals",(ulong)ref_node_local._4_4_,"re-init");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x2de,"ref_node_shift_new_globals",(ulong)uVar6,"allgather");
        ref_node_local._4_4_ = uVar6;
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_shift_new_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT new_nodes;
  REF_INT *everyones_new_nodes;
  REF_GLOB offset, total_new_nodes;
  REF_INT proc, node;

  ref_malloc(everyones_new_nodes, ref_mpi_n(ref_mpi), REF_INT);

  new_nodes = (REF_INT)(ref_node->new_n_global - ref_node->old_n_global);

  RSS(ref_mpi_allgather(ref_mpi, &new_nodes, everyones_new_nodes, REF_INT_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += everyones_new_nodes[proc];
  }

  total_new_nodes = 0;
  each_ref_mpi_part(ref_mpi, proc) {
    total_new_nodes += everyones_new_nodes[proc];
  }

  ref_free(everyones_new_nodes);

  if (0 != offset) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_global(ref_node, node) >= ref_node->old_n_global) {
        (ref_node->global[node]) += offset;
      }
    }
    for (node = ref_node_n(ref_node) - 1;
         node >= 0 && ref_node->sorted_global[node] >= ref_node->old_n_global;
         node--)
      ref_node->sorted_global[node] += offset;

    RSS(ref_node_shift_unused(ref_node, ref_node->old_n_global, offset),
        "shift");
  }

  RSS(ref_node_initialize_n_global(ref_node,
                                   total_new_nodes + ref_node->old_n_global),
      "re-init");

  return REF_SUCCESS;
}